

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O3

string * __thiscall
arbiter::Endpoint::prefixedRoot_abi_cxx11_(string *__return_storage_ptr__,Endpoint *this)

{
  size_type *psVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  string local_38;
  
  softPrefix_abi_cxx11_(&local_38,this);
  pcVar2 = (this->m_root)._M_dataplus._M_p;
  local_58 = local_48;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (this->m_root)._M_string_length);
  uVar4 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    uVar4 = local_38.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar4 < local_50 + local_38._M_string_length) {
    uVar5 = 0xf;
    if (local_58 != local_48) {
      uVar5 = local_48[0];
    }
    if (local_50 + local_38._M_string_length <= uVar5) {
      puVar3 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)&local_58,0,(char *)0x0,(ulong)local_38._M_dataplus._M_p);
      goto LAB_00144a33;
    }
  }
  puVar3 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58);
LAB_00144a33:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar4 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Endpoint::prefixedRoot() const
{
    return softPrefix() + root();
}